

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SupportVectorClassifier::Clear(SupportVectorClassifier *this)

{
  Arena *pAVar1;
  SupportVectorClassifier *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&this->numberofsupportvectorsperclass_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::Clear
            (&this->coefficients_);
  google::protobuf::RepeatedField<double>::Clear(&this->rho_);
  google::protobuf::RepeatedField<double>::Clear(&this->proba_);
  google::protobuf::RepeatedField<double>::Clear(&this->probb_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->kernel_ != (Kernel *)0x0)) &&
     (this->kernel_ != (Kernel *)0x0)) {
    (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->kernel_ = (Kernel *)0x0;
  clear_supportVectors(this);
  clear_ClassLabels(this);
  return;
}

Assistant:

void SupportVectorClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SupportVectorClassifier)
  numberofsupportvectorsperclass_.Clear();
  coefficients_.Clear();
  rho_.Clear();
  proba_.Clear();
  probb_.Clear();
  if (GetArenaNoVirtual() == NULL && kernel_ != NULL) {
    delete kernel_;
  }
  kernel_ = NULL;
  clear_supportVectors();
  clear_ClassLabels();
}